

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  int iVar41;
  undefined4 uVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong *puVar48;
  ulong *puVar49;
  ulong uVar50;
  ulong uVar51;
  ulong unaff_R12;
  size_t mask;
  ulong uVar52;
  ulong uVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  vint4 bi;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  vint4 ai;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar72;
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  uint uVar80;
  uint uVar81;
  undefined1 auVar79 [16];
  uint uVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong local_d38;
  RTCFilterFunctionNArguments local_c50;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_bf0 [16];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  undefined1 local_ba0 [32];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar97 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar65._4_4_ = fVar2;
  auVar65._0_4_ = fVar2;
  auVar65._8_4_ = fVar2;
  auVar65._12_4_ = fVar2;
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar67._4_4_ = fVar83;
  auVar67._0_4_ = fVar83;
  auVar67._8_4_ = fVar83;
  auVar67._12_4_ = fVar83;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar83 = fVar83 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar68._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar68._8_4_ = -fVar1;
  auVar68._12_4_ = -fVar1;
  auVar71._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar71._8_4_ = -fVar2;
  auVar71._12_4_ = -fVar2;
  auVar63._0_8_ = CONCAT44(fVar83,fVar83) ^ 0x8000000080000000;
  auVar63._8_4_ = -fVar83;
  auVar63._12_4_ = -fVar83;
  iVar41 = (tray->tnear).field_0.i[k];
  auVar75._4_4_ = iVar41;
  auVar75._0_4_ = iVar41;
  auVar75._8_4_ = iVar41;
  auVar75._12_4_ = iVar41;
  iVar41 = (tray->tfar).field_0.i[k];
  auVar79._4_4_ = iVar41;
  auVar79._0_4_ = iVar41;
  auVar79._8_4_ = iVar41;
  auVar79._12_4_ = iVar41;
  local_ba0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ba0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar41 = 1 << ((uint)k & 0x1f);
  auVar77._4_4_ = iVar41;
  auVar77._0_4_ = iVar41;
  auVar77._8_4_ = iVar41;
  auVar77._12_4_ = iVar41;
  auVar77._16_4_ = iVar41;
  auVar77._20_4_ = iVar41;
  auVar77._24_4_ = iVar41;
  auVar77._28_4_ = iVar41;
  auVar57 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar77 = vpand_avx2(auVar77,auVar57);
  local_be0 = vpcmpeqd_avx2(auVar77,auVar57);
  local_b60 = 0x7fffffff;
  uStack_b5c = 0x7fffffff;
  uStack_b58 = 0x7fffffff;
  uStack_b54 = 0x7fffffff;
  uStack_b50 = 0x7fffffff;
  uStack_b4c = 0x7fffffff;
  uStack_b48 = 0x7fffffff;
  uStack_b44 = 0x7fffffff;
  local_b80 = 0x80000000;
  uStack_b7c = 0x80000000;
  uStack_b78 = 0x80000000;
  uStack_b74 = 0x80000000;
  uStack_b70 = 0x80000000;
  uStack_b6c = 0x80000000;
  uStack_b68 = 0x80000000;
  uStack_b64 = 0x80000000;
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = &DAT_3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59._16_4_ = 0x3f800000;
  auVar59._20_4_ = 0x3f800000;
  auVar59._24_4_ = 0x3f800000;
  auVar59._28_4_ = 0x3f800000;
  auVar57._8_4_ = 0xbf800000;
  auVar57._0_8_ = 0xbf800000bf800000;
  auVar57._12_4_ = 0xbf800000;
  auVar57._16_4_ = 0xbf800000;
  auVar57._20_4_ = 0xbf800000;
  auVar57._24_4_ = 0xbf800000;
  auVar57._28_4_ = 0xbf800000;
  _local_bc0 = vblendvps_avx(auVar59,auVar57,local_ba0);
  puVar49 = local_7f8;
  do {
    puVar48 = puVar49;
    if (puVar48 == &local_800) break;
    puVar49 = puVar48 + -1;
    uVar53 = puVar48[-1];
    do {
      if ((uVar53 & 8) == 0) {
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar47),auVar68,
                                  auVar97._0_16_);
        auVar15 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar50),auVar71,auVar65);
        auVar56 = vpmaxsd_avx(auVar56,auVar15);
        auVar15 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + uVar51),auVar63,auVar67);
        auVar15 = vpmaxsd_avx(auVar15,auVar75);
        auVar56 = vpmaxsd_avx(auVar56,auVar15);
        auVar15 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar47 ^ 0x10)),auVar68,
                                  auVar97._0_16_);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar50 ^ 0x10)),auVar71,
                                  auVar65);
        auVar15 = vpminsd_avx(auVar15,auVar16);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar53 + 0x20 + (uVar51 ^ 0x10)),auVar63,
                                  auVar67);
        auVar16 = vpminsd_avx(auVar16,auVar79);
        auVar15 = vpminsd_avx(auVar15,auVar16);
        auVar56 = vpcmpgtd_avx(auVar56,auVar15);
        uVar42 = vmovmskps_avx(auVar56);
        unaff_R12 = (ulong)(byte)((byte)uVar42 ^ 0xf);
      }
      if ((uVar53 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar78 = 4;
        }
        else {
          uVar52 = uVar53 & 0xfffffffffffffff0;
          lVar45 = 0;
          for (uVar53 = unaff_R12; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
            lVar45 = lVar45 + 1;
          }
          for (uVar43 = unaff_R12 - 1 & unaff_R12; uVar53 = *(ulong *)(uVar52 + lVar45 * 8),
              uVar43 != 0; uVar43 = uVar43 - 1 & uVar43) {
            *puVar49 = uVar53;
            puVar49 = puVar49 + 1;
            lVar45 = 0;
            for (uVar53 = uVar43; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
              lVar45 = lVar45 + 1;
            }
          }
          uVar78 = 0;
        }
      }
      else {
        uVar78 = 6;
      }
    } while (uVar78 == 0);
    if (uVar78 == 6) {
      uVar52 = (ulong)((uint)uVar53 & 0xf);
      uVar78 = 0;
      uVar43 = uVar52 - 8;
      bVar54 = uVar52 != 8;
      if (bVar54) {
        uVar53 = uVar53 & 0xfffffffffffffff0;
        uVar52 = 0;
        do {
          lVar44 = uVar52 * 0xe0;
          lVar45 = uVar53 + 0xd0 + lVar44;
          local_b40 = *(undefined8 *)(lVar45 + 0x10);
          uStack_b38 = *(undefined8 *)(lVar45 + 0x18);
          lVar45 = uVar53 + 0xc0 + lVar44;
          local_b20 = *(undefined8 *)(lVar45 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar45 + 0x18);
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          uStack_b30 = local_b40;
          uStack_b28 = uStack_b38;
          auVar64._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x60 + lVar44);
          auVar64._0_16_ = *(undefined1 (*) [16])(uVar53 + lVar44);
          auVar69._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x70 + lVar44);
          auVar69._0_16_ = *(undefined1 (*) [16])(uVar53 + 0x10 + lVar44);
          auVar76._16_16_ = *(undefined1 (*) [16])(uVar53 + 0x80 + lVar44);
          auVar76._0_16_ = *(undefined1 (*) [16])(uVar53 + 0x20 + lVar44);
          auVar56 = *(undefined1 (*) [16])(uVar53 + 0x30 + lVar44);
          auVar58._16_16_ = auVar56;
          auVar58._0_16_ = auVar56;
          auVar15 = *(undefined1 (*) [16])(uVar53 + 0x40 + lVar44);
          auVar60._16_16_ = auVar15;
          auVar60._0_16_ = auVar15;
          auVar16 = *(undefined1 (*) [16])(uVar53 + 0x50 + lVar44);
          auVar61._16_16_ = auVar16;
          auVar61._0_16_ = auVar16;
          auVar16 = *(undefined1 (*) [16])(uVar53 + 0x90 + lVar44);
          auVar66._16_16_ = auVar16;
          auVar66._0_16_ = auVar16;
          auVar16 = *(undefined1 (*) [16])(uVar53 + 0xa0 + lVar44);
          auVar86._16_16_ = auVar16;
          auVar86._0_16_ = auVar16;
          auVar16 = *(undefined1 (*) [16])(uVar53 + 0xb0 + lVar44);
          auVar89._16_16_ = auVar16;
          auVar89._0_16_ = auVar16;
          auVar57 = vsubps_avx(auVar64,auVar58);
          auVar77 = vsubps_avx(auVar69,auVar60);
          auVar59 = vsubps_avx(auVar76,auVar61);
          auVar9 = vsubps_avx(auVar66,auVar64);
          auVar10 = vsubps_avx(auVar86,auVar69);
          auVar11 = vsubps_avx(auVar89,auVar76);
          auVar12._4_4_ = auVar11._4_4_ * auVar77._4_4_;
          auVar12._0_4_ = auVar11._0_4_ * auVar77._0_4_;
          auVar12._8_4_ = auVar11._8_4_ * auVar77._8_4_;
          auVar12._12_4_ = auVar11._12_4_ * auVar77._12_4_;
          auVar12._16_4_ = auVar11._16_4_ * auVar77._16_4_;
          auVar12._20_4_ = auVar11._20_4_ * auVar77._20_4_;
          auVar12._24_4_ = auVar11._24_4_ * auVar77._24_4_;
          auVar12._28_4_ = auVar56._12_4_;
          auVar17 = vfmsub231ps_fma(auVar12,auVar10,auVar59);
          auVar13._4_4_ = auVar59._4_4_ * auVar9._4_4_;
          auVar13._0_4_ = auVar59._0_4_ * auVar9._0_4_;
          auVar13._8_4_ = auVar59._8_4_ * auVar9._8_4_;
          auVar13._12_4_ = auVar59._12_4_ * auVar9._12_4_;
          auVar13._16_4_ = auVar59._16_4_ * auVar9._16_4_;
          auVar13._20_4_ = auVar59._20_4_ * auVar9._20_4_;
          auVar13._24_4_ = auVar59._24_4_ * auVar9._24_4_;
          auVar13._28_4_ = auVar15._12_4_;
          auVar18 = vfmsub231ps_fma(auVar13,auVar11,auVar57);
          uVar42 = *(undefined4 *)(ray + k * 4);
          auVar91._4_4_ = uVar42;
          auVar91._0_4_ = uVar42;
          auVar91._8_4_ = uVar42;
          auVar91._12_4_ = uVar42;
          auVar91._16_4_ = uVar42;
          auVar91._20_4_ = uVar42;
          auVar91._24_4_ = uVar42;
          auVar91._28_4_ = uVar42;
          uVar42 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar93._4_4_ = uVar42;
          auVar93._0_4_ = uVar42;
          auVar93._8_4_ = uVar42;
          auVar93._12_4_ = uVar42;
          auVar93._16_4_ = uVar42;
          auVar93._20_4_ = uVar42;
          auVar93._24_4_ = uVar42;
          auVar93._28_4_ = uVar42;
          uVar42 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar95._4_4_ = uVar42;
          auVar95._0_4_ = uVar42;
          auVar95._8_4_ = uVar42;
          auVar95._12_4_ = uVar42;
          auVar95._16_4_ = uVar42;
          auVar95._20_4_ = uVar42;
          auVar95._24_4_ = uVar42;
          auVar95._28_4_ = uVar42;
          fVar1 = *(float *)(ray + k * 4 + 0x80);
          auVar87._4_4_ = fVar1;
          auVar87._0_4_ = fVar1;
          auVar87._8_4_ = fVar1;
          auVar87._12_4_ = fVar1;
          auVar87._16_4_ = fVar1;
          auVar87._20_4_ = fVar1;
          auVar87._24_4_ = fVar1;
          auVar87._28_4_ = fVar1;
          auVar12 = vsubps_avx(auVar64,auVar91);
          fVar2 = *(float *)(ray + k * 4 + 0xa0);
          auVar92._4_4_ = fVar2;
          auVar92._0_4_ = fVar2;
          auVar92._8_4_ = fVar2;
          auVar92._12_4_ = fVar2;
          auVar92._16_4_ = fVar2;
          auVar92._20_4_ = fVar2;
          auVar92._24_4_ = fVar2;
          auVar92._28_4_ = fVar2;
          auVar13 = vsubps_avx(auVar69,auVar93);
          fVar83 = *(float *)(ray + k * 4 + 0xc0);
          auVar94._4_4_ = fVar83;
          auVar94._0_4_ = fVar83;
          auVar94._8_4_ = fVar83;
          auVar94._12_4_ = fVar83;
          auVar94._16_4_ = fVar83;
          auVar94._20_4_ = fVar83;
          auVar94._24_4_ = fVar83;
          auVar94._28_4_ = fVar83;
          auVar58 = vsubps_avx(auVar76,auVar95);
          auVar21._4_4_ = fVar1 * auVar13._4_4_;
          auVar21._0_4_ = fVar1 * auVar13._0_4_;
          auVar21._8_4_ = fVar1 * auVar13._8_4_;
          auVar21._12_4_ = fVar1 * auVar13._12_4_;
          auVar21._16_4_ = fVar1 * auVar13._16_4_;
          auVar21._20_4_ = fVar1 * auVar13._20_4_;
          auVar21._24_4_ = fVar1 * auVar13._24_4_;
          auVar21._28_4_ = uVar42;
          auVar56 = vfmsub231ps_fma(auVar21,auVar12,auVar92);
          auVar22._4_4_ = auVar11._4_4_ * auVar56._4_4_;
          auVar22._0_4_ = auVar11._0_4_ * auVar56._0_4_;
          auVar22._8_4_ = auVar11._8_4_ * auVar56._8_4_;
          auVar22._12_4_ = auVar11._12_4_ * auVar56._12_4_;
          auVar22._16_4_ = auVar11._16_4_ * 0.0;
          auVar22._20_4_ = auVar11._20_4_ * 0.0;
          auVar22._24_4_ = auVar11._24_4_ * 0.0;
          auVar22._28_4_ = auVar11._28_4_;
          auVar96._0_4_ = auVar59._0_4_ * auVar56._0_4_;
          auVar96._4_4_ = auVar59._4_4_ * auVar56._4_4_;
          auVar96._8_4_ = auVar59._8_4_ * auVar56._8_4_;
          auVar96._12_4_ = auVar59._12_4_ * auVar56._12_4_;
          auVar96._16_4_ = auVar59._16_4_ * 0.0;
          auVar96._20_4_ = auVar59._20_4_ * 0.0;
          auVar96._24_4_ = auVar59._24_4_ * 0.0;
          auVar96._28_4_ = 0;
          auVar11._4_4_ = fVar83 * auVar12._4_4_;
          auVar11._0_4_ = fVar83 * auVar12._0_4_;
          auVar11._8_4_ = fVar83 * auVar12._8_4_;
          auVar11._12_4_ = fVar83 * auVar12._12_4_;
          auVar11._16_4_ = fVar83 * auVar12._16_4_;
          auVar11._20_4_ = fVar83 * auVar12._20_4_;
          auVar11._24_4_ = fVar83 * auVar12._24_4_;
          auVar11._28_4_ = auVar59._28_4_;
          auVar15 = vfmsub231ps_fma(auVar11,auVar58,auVar87);
          auVar56 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar15),auVar10);
          auVar15 = vfmadd231ps_fma(auVar96,auVar77,ZEXT1632(auVar15));
          auVar23._4_4_ = auVar57._4_4_ * auVar10._4_4_;
          auVar23._0_4_ = auVar57._0_4_ * auVar10._0_4_;
          auVar23._8_4_ = auVar57._8_4_ * auVar10._8_4_;
          auVar23._12_4_ = auVar57._12_4_ * auVar10._12_4_;
          auVar23._16_4_ = auVar57._16_4_ * auVar10._16_4_;
          auVar23._20_4_ = auVar57._20_4_ * auVar10._20_4_;
          auVar23._24_4_ = auVar57._24_4_ * auVar10._24_4_;
          auVar23._28_4_ = auVar10._28_4_;
          auVar19 = vfmsub231ps_fma(auVar23,auVar9,auVar77);
          auVar10._4_4_ = fVar2 * auVar58._4_4_;
          auVar10._0_4_ = fVar2 * auVar58._0_4_;
          auVar10._8_4_ = fVar2 * auVar58._8_4_;
          auVar10._12_4_ = fVar2 * auVar58._12_4_;
          auVar10._16_4_ = fVar2 * auVar58._16_4_;
          auVar10._20_4_ = fVar2 * auVar58._20_4_;
          auVar10._24_4_ = fVar2 * auVar58._24_4_;
          auVar10._28_4_ = auVar77._28_4_;
          auVar20 = vfmsub231ps_fma(auVar10,auVar13,auVar94);
          fVar1 = auVar19._0_4_;
          fVar2 = auVar19._4_4_;
          auVar24._4_4_ = fVar83 * fVar2;
          auVar24._0_4_ = fVar83 * fVar1;
          fVar7 = auVar19._8_4_;
          auVar24._8_4_ = fVar83 * fVar7;
          fVar8 = auVar19._12_4_;
          auVar24._12_4_ = fVar83 * fVar8;
          auVar24._16_4_ = fVar83 * 0.0;
          auVar24._20_4_ = fVar83 * 0.0;
          auVar24._24_4_ = fVar83 * 0.0;
          auVar24._28_4_ = fVar83;
          auVar16 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar18),auVar92);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar17),auVar87);
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar20),auVar9);
          auVar9._4_4_ = uStack_b7c;
          auVar9._0_4_ = local_b80;
          auVar9._8_4_ = uStack_b78;
          auVar9._12_4_ = uStack_b74;
          auVar9._16_4_ = uStack_b70;
          auVar9._20_4_ = uStack_b6c;
          auVar9._24_4_ = uStack_b68;
          auVar9._28_4_ = uStack_b64;
          auVar77 = vandps_avx(ZEXT1632(auVar16),auVar9);
          uVar78 = auVar77._0_4_;
          local_b00._0_4_ = (float)(uVar78 ^ auVar56._0_4_);
          uVar80 = auVar77._4_4_;
          local_b00._4_4_ = (float)(uVar80 ^ auVar56._4_4_);
          uVar81 = auVar77._8_4_;
          local_b00._8_4_ = (float)(uVar81 ^ auVar56._8_4_);
          uVar82 = auVar77._12_4_;
          local_b00._12_4_ = (float)(uVar82 ^ auVar56._12_4_);
          fVar83 = auVar77._16_4_;
          local_b00._16_4_ = fVar83;
          fVar84 = auVar77._20_4_;
          local_b00._20_4_ = fVar84;
          fVar85 = auVar77._24_4_;
          local_b00._24_4_ = fVar85;
          fStack_9a4 = auVar77._28_4_;
          local_b00._28_4_ = fStack_9a4;
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar57,ZEXT1632(auVar20));
          local_ae0._0_4_ = (float)(uVar78 ^ auVar56._0_4_);
          local_ae0._4_4_ = (float)(uVar80 ^ auVar56._4_4_);
          local_ae0._8_4_ = (float)(uVar81 ^ auVar56._8_4_);
          local_ae0._12_4_ = (float)(uVar82 ^ auVar56._12_4_);
          local_ae0._16_4_ = fVar83;
          local_ae0._20_4_ = fVar84;
          local_ae0._24_4_ = fVar85;
          local_ae0._28_4_ = fStack_9a4;
          auVar77 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
          auVar57 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
          auVar77 = vandps_avx(auVar57,auVar77);
          auVar40._4_4_ = uStack_b5c;
          auVar40._0_4_ = local_b60;
          auVar40._8_4_ = uStack_b58;
          auVar40._12_4_ = uStack_b54;
          auVar40._16_4_ = uStack_b50;
          auVar40._20_4_ = uStack_b4c;
          auVar40._24_4_ = uStack_b48;
          auVar40._28_4_ = uStack_b44;
          local_aa0 = vandps_avx(ZEXT1632(auVar16),auVar40);
          auVar57 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
          auVar77 = vandps_avx(auVar77,auVar57);
          auVar90._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
          auVar90._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
          auVar90._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
          auVar90._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
          auVar90._16_4_ = fVar83 + fVar83;
          auVar90._20_4_ = fVar84 + fVar84;
          auVar90._24_4_ = fVar85 + fVar85;
          auVar90._28_4_ = fStack_9a4 + fStack_9a4;
          auVar57 = vcmpps_avx(auVar90,local_aa0,2);
          auVar59 = auVar57 & auVar77;
          if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar59 >> 0x7f,0) != '\0') ||
                (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar59 >> 0xbf,0) != '\0') ||
              (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar59[0x1f] < '\0') {
            auVar77 = vandps_avx(auVar77,auVar57);
            auVar56 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
            auVar25._4_4_ = auVar58._4_4_ * fVar2;
            auVar25._0_4_ = auVar58._0_4_ * fVar1;
            auVar25._8_4_ = auVar58._8_4_ * fVar7;
            auVar25._12_4_ = auVar58._12_4_ * fVar8;
            auVar25._16_4_ = auVar58._16_4_ * 0.0;
            auVar25._20_4_ = auVar58._20_4_ * 0.0;
            auVar25._24_4_ = auVar58._24_4_ * 0.0;
            auVar25._28_4_ = auVar58._28_4_;
            auVar15 = vfmadd213ps_fma(auVar13,ZEXT1632(auVar18),auVar25);
            auVar15 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar17),ZEXT1632(auVar15));
            local_ac0._0_4_ = (float)(uVar78 ^ auVar15._0_4_);
            local_ac0._4_4_ = (float)(uVar80 ^ auVar15._4_4_);
            local_ac0._8_4_ = (float)(uVar81 ^ auVar15._8_4_);
            local_ac0._12_4_ = (float)(uVar82 ^ auVar15._12_4_);
            local_ac0._16_4_ = fVar83;
            local_ac0._20_4_ = fVar84;
            local_ac0._24_4_ = fVar85;
            local_ac0._28_4_ = fStack_9a4;
            fVar70 = *(float *)(ray + k * 4 + 0x60);
            auVar26._4_4_ = local_aa0._4_4_ * fVar70;
            auVar26._0_4_ = local_aa0._0_4_ * fVar70;
            auVar26._8_4_ = local_aa0._8_4_ * fVar70;
            auVar26._12_4_ = local_aa0._12_4_ * fVar70;
            auVar26._16_4_ = local_aa0._16_4_ * fVar70;
            auVar26._20_4_ = local_aa0._20_4_ * fVar70;
            auVar26._24_4_ = local_aa0._24_4_ * fVar70;
            auVar26._28_4_ = fVar70;
            auVar77 = vcmpps_avx(auVar26,local_ac0,1);
            fVar70 = *(float *)(ray + k * 4 + 0x100);
            auVar27._4_4_ = fVar70 * local_aa0._4_4_;
            auVar27._0_4_ = fVar70 * local_aa0._0_4_;
            auVar27._8_4_ = fVar70 * local_aa0._8_4_;
            auVar27._12_4_ = fVar70 * local_aa0._12_4_;
            auVar27._16_4_ = fVar70 * local_aa0._16_4_;
            auVar27._20_4_ = fVar70 * local_aa0._20_4_;
            auVar27._24_4_ = fVar70 * local_aa0._24_4_;
            auVar27._28_4_ = fVar70;
            auVar57 = vcmpps_avx(local_ac0,auVar27,2);
            auVar77 = vandps_avx(auVar57,auVar77);
            auVar15 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
            auVar56 = vpand_avx(auVar56,auVar15);
            auVar77 = vpmovzxwd_avx2(auVar56);
            auVar77 = vpslld_avx2(auVar77,0x1f);
            if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar77 >> 0x7f,0) != '\0') ||
                  (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar77 >> 0xbf,0) != '\0') ||
                (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar77[0x1f] < '\0') {
              local_a20 = vpsrad_avx2(auVar77,0x1f);
              local_a80 = ZEXT1632(auVar17);
              local_a60 = ZEXT1632(auVar18);
              local_a40 = ZEXT1632(auVar19);
              auVar77 = vrcpps_avx(local_aa0);
              local_940 = local_ba0;
              pSVar4 = context->scene;
              auVar88._8_4_ = 0x3f800000;
              auVar88._0_8_ = &DAT_3f8000003f800000;
              auVar88._12_4_ = 0x3f800000;
              auVar88._16_4_ = 0x3f800000;
              auVar88._20_4_ = 0x3f800000;
              auVar88._24_4_ = 0x3f800000;
              auVar88._28_4_ = 0x3f800000;
              auVar15 = vfnmadd213ps_fma(local_aa0,auVar77,auVar88);
              auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar77,auVar77);
              fVar70 = auVar15._0_4_;
              fVar72 = auVar15._4_4_;
              fVar73 = auVar15._8_4_;
              fVar74 = auVar15._12_4_;
              local_9c0[0] = fVar70 * local_ac0._0_4_;
              local_9c0[1] = fVar72 * local_ac0._4_4_;
              local_9c0[2] = fVar73 * local_ac0._8_4_;
              local_9c0[3] = fVar74 * local_ac0._12_4_;
              fStack_9b0 = fVar83 * 0.0;
              fStack_9ac = fVar84 * 0.0;
              fStack_9a8 = fVar85 * 0.0;
              auVar28._4_4_ = fVar72 * local_b00._4_4_;
              auVar28._0_4_ = fVar70 * local_b00._0_4_;
              auVar28._8_4_ = fVar73 * local_b00._8_4_;
              auVar28._12_4_ = fVar74 * local_b00._12_4_;
              auVar28._16_4_ = fVar83 * 0.0;
              auVar28._20_4_ = fVar84 * 0.0;
              auVar28._24_4_ = fVar85 * 0.0;
              auVar28._28_4_ = fStack_9a4;
              auVar77 = vminps_avx(auVar28,auVar88);
              auVar29._4_4_ = fVar72 * local_ae0._4_4_;
              auVar29._0_4_ = fVar70 * local_ae0._0_4_;
              auVar29._8_4_ = fVar73 * local_ae0._8_4_;
              auVar29._12_4_ = fVar74 * local_ae0._12_4_;
              auVar29._16_4_ = fVar83 * 0.0;
              auVar29._20_4_ = fVar84 * 0.0;
              auVar29._24_4_ = fVar85 * 0.0;
              auVar29._28_4_ = fStack_9a4;
              auVar57 = vminps_avx(auVar29,auVar88);
              auVar59 = vsubps_avx(auVar88,auVar77);
              auVar9 = vsubps_avx(auVar88,auVar57);
              local_9e0 = vblendvps_avx(auVar57,auVar59,local_ba0);
              local_a00 = vblendvps_avx(auVar77,auVar9,local_ba0);
              local_9a0._0_4_ = auVar17._0_4_ * (float)local_bc0._0_4_;
              local_9a0._4_4_ = auVar17._4_4_ * (float)local_bc0._4_4_;
              local_9a0._8_4_ = auVar17._8_4_ * fStack_bb8;
              local_9a0._12_4_ = auVar17._12_4_ * fStack_bb4;
              local_9a0._16_4_ = fStack_bb0 * 0.0;
              local_9a0._20_4_ = fStack_bac * 0.0;
              local_9a0._24_4_ = fStack_ba8 * 0.0;
              local_9a0._28_4_ = 0;
              local_980._0_4_ = (float)local_bc0._0_4_ * auVar18._0_4_;
              local_980._4_4_ = (float)local_bc0._4_4_ * auVar18._4_4_;
              local_980._8_4_ = fStack_bb8 * auVar18._8_4_;
              local_980._12_4_ = fStack_bb4 * auVar18._12_4_;
              local_980._16_4_ = fStack_bb0 * 0.0;
              local_980._20_4_ = fStack_bac * 0.0;
              local_980._24_4_ = fStack_ba8 * 0.0;
              local_980._28_4_ = 0;
              local_960._0_4_ = (float)local_bc0._0_4_ * fVar1;
              local_960._4_4_ = (float)local_bc0._4_4_ * fVar2;
              local_960._8_4_ = fStack_bb8 * fVar7;
              local_960._12_4_ = fStack_bb4 * fVar8;
              local_960._16_4_ = fStack_bb0 * 0.0;
              local_960._20_4_ = fStack_bac * 0.0;
              local_960._24_4_ = fStack_ba8 * 0.0;
              local_960._28_4_ = 0;
              auVar56 = vpsllw_avx(auVar56,0xf);
              auVar56 = vpacksswb_avx(auVar56,auVar56);
              local_d38 = (ulong)(byte)(SUB161(auVar56 >> 7,0) & 1 |
                                        (SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                        (SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                                        (SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                                        (SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                                        (SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                                        (SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                                       SUB161(auVar56 >> 0x3f,0) << 7);
              do {
                local_bf0 = auVar97._0_16_;
                uVar14 = 0;
                for (uVar46 = local_d38; (uVar46 & 1) == 0;
                    uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                  uVar14 = uVar14 + 1;
                }
                uVar78 = *(uint *)((long)&local_b20 + uVar14 * 4);
                pGVar5 = (pSVar4->geometries).items[uVar78].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  local_d38 = local_d38 ^ 1L << (uVar14 & 0x3f);
                  bVar55 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar55 = false;
                }
                else {
                  uVar42 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar46 = (ulong)(uint)((int)uVar14 * 4);
                  uVar3 = *(undefined4 *)(local_a00 + uVar46);
                  local_8c0._4_4_ = uVar3;
                  local_8c0._0_4_ = uVar3;
                  local_8c0._8_4_ = uVar3;
                  local_8c0._12_4_ = uVar3;
                  local_8c0._16_4_ = uVar3;
                  local_8c0._20_4_ = uVar3;
                  local_8c0._24_4_ = uVar3;
                  local_8c0._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_9e0 + uVar46);
                  local_8a0._4_4_ = uVar3;
                  local_8a0._0_4_ = uVar3;
                  local_8a0._8_4_ = uVar3;
                  local_8a0._12_4_ = uVar3;
                  local_8a0._16_4_ = uVar3;
                  local_8a0._20_4_ = uVar3;
                  local_8a0._24_4_ = uVar3;
                  local_8a0._28_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar46);
                  local_c50.context = context->user;
                  local_880 = *(undefined4 *)((long)&local_b40 + uVar46);
                  local_920 = *(undefined4 *)(local_9a0 + uVar46);
                  local_900 = *(undefined4 *)(local_980 + uVar46);
                  local_8e0 = *(undefined4 *)(local_960 + uVar46);
                  local_860._4_4_ = uVar78;
                  local_860._0_4_ = uVar78;
                  local_860._8_4_ = uVar78;
                  local_860._12_4_ = uVar78;
                  local_860._16_4_ = uVar78;
                  local_860._20_4_ = uVar78;
                  local_860._24_4_ = uVar78;
                  local_860._28_4_ = uVar78;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_87c = local_880;
                  uStack_878 = local_880;
                  uStack_874 = local_880;
                  uStack_870 = local_880;
                  uStack_86c = local_880;
                  uStack_868 = local_880;
                  uStack_864 = local_880;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_c50.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c50.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c20 = local_be0._0_8_;
                  uStack_c18 = local_be0._8_8_;
                  uStack_c10 = local_be0._16_8_;
                  uStack_c08 = local_be0._24_8_;
                  local_c50.valid = (int *)&local_c20;
                  local_c50.geometryUserPtr = pGVar5->userPtr;
                  local_c50.hit = (RTCHitN *)&local_920;
                  local_c50.N = 8;
                  local_c50.ray = (RTCRayN *)ray;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&local_c50);
                  }
                  auVar38._8_8_ = uStack_c18;
                  auVar38._0_8_ = local_c20;
                  auVar38._16_8_ = uStack_c10;
                  auVar38._24_8_ = uStack_c08;
                  auVar57 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
                  auVar77 = _DAT_0205a980 & ~auVar57;
                  if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar77 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar77 >> 0x7f,0) == '\0') &&
                        (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar77 >> 0xbf,0) == '\0') &&
                      (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar77[0x1f]) {
                    auVar57 = auVar57 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_c50);
                    }
                    auVar39._8_8_ = uStack_c18;
                    auVar39._0_8_ = local_c20;
                    auVar39._16_8_ = uStack_c10;
                    auVar39._24_8_ = uStack_c08;
                    auVar77 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar39);
                    auVar57 = auVar77 ^ _DAT_0205a980;
                    auVar62._8_4_ = 0xff800000;
                    auVar62._0_8_ = 0xff800000ff800000;
                    auVar62._12_4_ = 0xff800000;
                    auVar62._16_4_ = 0xff800000;
                    auVar62._20_4_ = 0xff800000;
                    auVar62._24_4_ = 0xff800000;
                    auVar62._28_4_ = 0xff800000;
                    auVar77 = vblendvps_avx(auVar62,*(undefined1 (*) [32])(local_c50.ray + 0x100),
                                            auVar77);
                    *(undefined1 (*) [32])(local_c50.ray + 0x100) = auVar77;
                  }
                  bVar36 = (auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar37 = (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar35 = (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar34 = SUB321(auVar57 >> 0x7f,0) == '\0';
                  bVar33 = (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar32 = SUB321(auVar57 >> 0xbf,0) == '\0';
                  bVar31 = (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar30 = -1 < auVar57[0x1f];
                  bVar55 = ((((((bVar36 && bVar37) && bVar35) && bVar34) && bVar33) && bVar32) &&
                           bVar31) && bVar30;
                  if (((((((bVar36 && bVar37) && bVar35) && bVar34) && bVar33) && bVar32) && bVar31)
                      && bVar30) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar42;
                    local_d38 = local_d38 ^ 1L << (uVar14 & 0x3f);
                  }
                  auVar97 = ZEXT1664(local_bf0);
                }
                uVar78 = 0;
                if (!bVar55) {
                  if (bVar54) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar78 = 1;
                  }
                  goto LAB_005eb172;
                }
              } while (local_d38 != 0);
            }
          }
          uVar78 = 0;
          uVar52 = uVar52 + 1;
          bVar54 = uVar52 < uVar43;
        } while (uVar52 != uVar43);
      }
    }
LAB_005eb172:
  } while ((uVar78 & 3) == 0);
  return puVar48 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }